

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprCompareVariable(Parse *pParse,Expr *pVar,Expr *pExpr)

{
  long lVar1;
  sqlite3 *in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  sqlite3_value *pL;
  int iVar;
  int res;
  sqlite3_value *pR;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_14 = 2;
  if ((*(char *)&in_RDX->pVfs == -99) && (*(short *)(in_RSI + 0x30) == (short)in_RDX->flags)) {
    local_14 = 0;
  }
  else if ((*(ulong *)(*in_RDI + 0x30) & 0x800000) == 0) {
    sqlite3ValueFromExpr
              (in_RDX,(Expr *)0x2aaaaaaaa,0xaa,0xaa,
               (sqlite3_value **)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  else {
    local_14 = 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

static SQLITE_NOINLINE int exprCompareVariable(
  const Parse *pParse,
  const Expr *pVar,
  const Expr *pExpr
){
  int res = 2;
  int iVar;
  sqlite3_value *pL, *pR = 0;

  if( pExpr->op==TK_VARIABLE && pVar->iColumn==pExpr->iColumn ){
    return 0;
  }
  if( (pParse->db->flags & SQLITE_EnableQPSG)!=0 ) return 2;
  sqlite3ValueFromExpr(pParse->db, pExpr, SQLITE_UTF8, SQLITE_AFF_BLOB, &pR);
  if( pR ){
    iVar = pVar->iColumn;
    sqlite3VdbeSetVarmask(pParse->pVdbe, iVar);
    pL = sqlite3VdbeGetBoundValue(pParse->pReprepare, iVar, SQLITE_AFF_BLOB);
    if( pL ){
      if( sqlite3_value_type(pL)==SQLITE_TEXT ){
        sqlite3_value_text(pL); /* Make sure the encoding is UTF-8 */
      }
      res = sqlite3MemCompare(pL, pR, 0) ? 2 : 0;
    }
    sqlite3ValueFree(pR);
    sqlite3ValueFree(pL);
  }
  return res;
}